

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O1

void fdsocket_set_frozen(Socket *s,_Bool is_frozen)

{
  void *e;
  int iStack_c;
  
  iStack_c = *(int *)((long)&s[-0x412].vt + 4);
  if (iStack_c < 0) {
    return;
  }
  if (!is_frozen) {
    uxsel_set(iStack_c,1,fdsocket_select_result_input);
    return;
  }
  e = find234(fds,&iStack_c,uxsel_fd_findcmp);
  if (e != (void *)0x0) {
    if (*(uxsel_id **)((long)e + 0x10) != (uxsel_id *)0x0) {
      uxsel_input_remove(*(uxsel_id **)((long)e + 0x10));
    }
    del234(fds,e);
    safefree(e);
  }
  return;
}

Assistant:

static void fdsocket_set_frozen(Socket *s, bool is_frozen)
{
    FdSocket *fds = container_of(s, FdSocket, sock);

    if (fds->infd < 0)
        return;

    if (is_frozen)
        uxsel_del(fds->infd);
    else
        uxsel_set(fds->infd, SELECT_R, fdsocket_select_result_input);
}